

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LLVMDependenceGraph.cpp
# Opt level: O3

void __thiscall
dg::LLVMDependenceGraph::handleInstruction
          (LLVMDependenceGraph *this,Value *val,LLVMNode *node,LLVMNode *prevNode)

{
  ControlEdgesT *this_00;
  Value VVar1;
  LLVMPointerAnalysis *pLVar2;
  pointer ppFVar3;
  pointer ppFVar4;
  LLVMPointsToSetImpl *pLVar5;
  char cVar6;
  bool bVar7;
  int iVar8;
  LLVMNode *pLVar9;
  raw_ostream *prVar10;
  size_t sVar11;
  raw_ostream *this_01;
  LLVMDependenceGraph *pLVar12;
  int *piVar13;
  char *pcVar14;
  Function *pFVar15;
  size_t __n;
  Function **function;
  undefined8 uVar16;
  _Rb_tree<dg::LLVMNode*,dg::LLVMNode*,std::_Identity<dg::LLVMNode*>,std::less<dg::LLVMNode*>,std::allocator<dg::LLVMNode*>>
  *this_02;
  Function **function_1;
  Value *pVVar17;
  long lVar18;
  Function *callFunc;
  undefined1 auVar19 [16];
  StringRef Str;
  const_iterator __begin3;
  vector<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_> possibleFunctions;
  const_iterator __end3;
  LLVMNode *local_70;
  const_iterator local_68;
  vector<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_> local_60;
  LLVMPointsToSetImpl *local_48;
  Value *local_40;
  const_iterator local_38;
  
  VVar1 = val[0x10];
  local_70 = node;
  if (val == (Value *)0x0 || VVar1 != (Value)0x53) {
    if (VVar1 != (Value)0x22) {
      if ((byte)VVar1 < 0x1b || val == (Value *)0x0) {
        return;
      }
      if (VVar1 != (Value)0x3d) {
        if (VVar1 == (Value)0x3c) {
          if ((*(uint *)(val + 0x14) >> 0x1e & 1) == 0) {
            pVVar17 = val + -(ulong)(*(uint *)(val + 0x14) << 5);
          }
          else {
            pVVar17 = *(Value **)(val + -8);
          }
          pVVar17 = (Value *)llvm::Value::stripInBoundsOffsets
                                       (*(undefined8 *)pVVar17,
                                        llvm::function_ref<void(llvm::Value_const*)>::
                                        callback_fn<llvm::Value::stripInBoundsOffsets(llvm::function_ref<void(llvm::Value_const*)>)::_default_arg_1_::_lambda(llvm::Value_const*)_1_>
                                        ,&local_60);
          if (pVVar17[0x10] == (Value)0x3) {
            addFormalGlobal(this,pVVar17);
          }
          if ((*(uint *)(val + 0x14) >> 0x1e & 1) == 0) {
            lVar18 = (long)val - (ulong)(*(uint *)(val + 0x14) << 5);
          }
          else {
            lVar18 = *(long *)(val + -8);
          }
          uVar16 = *(undefined8 *)(lVar18 + 0x20);
          goto LAB_00111545;
        }
        if (VVar1 != (Value)0x3b) {
          return;
        }
      }
      if ((*(uint *)(val + 0x14) >> 0x1e & 1) == 0) {
        pVVar17 = val + -(ulong)(*(uint *)(val + 0x14) << 5);
      }
      else {
        pVVar17 = *(Value **)(val + -8);
      }
      uVar16 = *(undefined8 *)pVVar17;
LAB_00111545:
      pVVar17 = (Value *)llvm::Value::stripInBoundsOffsets
                                   (uVar16,llvm::function_ref<void(llvm::Value_const*)>::
                                           callback_fn<llvm::Value::stripInBoundsOffsets(llvm::function_ref<void(llvm::Value_const*)>)::_default_arg_1_::_lambda(llvm::Value_const*)_1_>
                                    ,&local_60);
      if (pVVar17[0x10] != (Value)0x3) {
        return;
      }
      addFormalGlobal(this,pVVar17);
      return;
    }
    pLVar9 = getOrCreateNoReturn(this);
    this_00 = &(pLVar9->super_Node<dg::LLVMDependenceGraph,_llvm::Value_*,_dg::LLVMNode>).
               revControlDepEdges;
    local_60.super__Vector_base<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)node;
    std::
    _Rb_tree<dg::LLVMNode*,dg::LLVMNode*,std::_Identity<dg::LLVMNode*>,std::less<dg::LLVMNode*>,std::allocator<dg::LLVMNode*>>
    ::_M_insert_unique<dg::LLVMNode*const&>
              ((_Rb_tree<dg::LLVMNode*,dg::LLVMNode*,std::_Identity<dg::LLVMNode*>,std::less<dg::LLVMNode*>,std::allocator<dg::LLVMNode*>>
                *)this_00,(LLVMNode **)&local_60);
    local_60.super__Vector_base<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)pLVar9;
    std::
    _Rb_tree<dg::LLVMNode*,dg::LLVMNode*,std::_Identity<dg::LLVMNode*>,std::less<dg::LLVMNode*>,std::allocator<dg::LLVMNode*>>
    ::_M_insert_unique<dg::LLVMNode*const&>
              ((_Rb_tree<dg::LLVMNode*,dg::LLVMNode*,std::_Identity<dg::LLVMNode*>,std::less<dg::LLVMNode*>,std::allocator<dg::LLVMNode*>>
                *)&(node->super_Node<dg::LLVMDependenceGraph,_llvm::Value_*,_dg::LLVMNode>).
                   controlDepEdges,(LLVMNode **)&local_60);
    if (prevNode == (LLVMNode *)0x0) {
      return;
    }
    this_02 = (_Rb_tree<dg::LLVMNode*,dg::LLVMNode*,std::_Identity<dg::LLVMNode*>,std::less<dg::LLVMNode*>,std::allocator<dg::LLVMNode*>>
               *)&(prevNode->super_Node<dg::LLVMDependenceGraph,_llvm::Value_*,_dg::LLVMNode>).
                  controlDepEdges;
    local_60.super__Vector_base<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)prevNode;
    std::
    _Rb_tree<dg::LLVMNode*,dg::LLVMNode*,std::_Identity<dg::LLVMNode*>,std::less<dg::LLVMNode*>,std::allocator<dg::LLVMNode*>>
    ::_M_insert_unique<dg::LLVMNode*const&>
              ((_Rb_tree<dg::LLVMNode*,dg::LLVMNode*,std::_Identity<dg::LLVMNode*>,std::less<dg::LLVMNode*>,std::allocator<dg::LLVMNode*>>
                *)this_00,(LLVMNode **)&local_60);
    local_60.super__Vector_base<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)pLVar9;
    goto LAB_0011187f;
  }
  prVar10 = (raw_ostream *)llvm::Value::stripPointerCasts();
  callFunc = (Function *)0x0;
  if (prVar10[0x10] == (raw_ostream)0x0) {
    callFunc = (Function *)prVar10;
  }
  if (callFunc == (Function *)0x0) {
    if (*(char *)(*(long *)(val + -0x20) + 0x10) != '\x17') {
      pLVar2 = this->PTA;
      if (pLVar2 != (LLVMPointerAnalysis *)0x0) {
        (**(code **)(*(long *)pLVar2 + 8))(&local_48,pLVar2,prVar10);
        lVar18 = (**(code **)(*(long *)local_48 + 0x20))();
        if (lVar18 == 0) {
          this_01 = (raw_ostream *)llvm::errs();
          Str.Length = 0xf;
          Str.Data = "Had no PTA node";
          llvm::raw_ostream::operator<<(this_01,Str);
          if (prVar10[0x10] == (raw_ostream)0x0) {
            pcVar14 = (char *)llvm::Value::getName();
            llvm::raw_ostream::operator<<(this_01,pcVar14);
          }
          else {
            llvm::Value::print(prVar10,SUB81(this_01,0));
          }
          if (*(undefined1 **)(this_01 + 0x18) == *(undefined1 **)(this_01 + 0x20)) {
            llvm::raw_ostream::write((char *)this_01,0x11a0f4);
          }
          else {
            **(undefined1 **)(this_01 + 0x20) = 10;
            *(long *)(this_01 + 0x20) = *(long *)(this_01 + 0x20) + 1;
          }
        }
        pLVar5 = local_48;
        if (local_48 == (LLVMPointsToSetImpl *)0x0) {
          local_68.impl = (LLVMPointsToSetImpl *)0x0;
        }
        else {
          cVar6 = (**(code **)(*(long *)local_48 + 0x38))(local_48);
          local_68.impl = (LLVMPointsToSetImpl *)0x0;
          if (cVar6 == '\0') {
            local_68.impl = pLVar5;
          }
        }
        local_38.impl = (LLVMPointsToSetImpl *)0x0;
        bVar7 = LLVMPointsToSet::const_iterator::operator==(&local_68,&local_38);
        if (!bVar7) {
          local_40 = val + 0x40;
          do {
            pFVar15 = (Function *)(**(code **)(*(long *)local_68.impl + 0x48))();
            if (pFVar15 != (Function *)0x0 && pFVar15[0x10] == (Function)0x0) {
              if ((*(Function **)(pFVar15 + 0x48) == pFVar15 + 0x48) ||
                 (bVar7 = llvmutils::callIsCompatible(pFVar15,(CallInst *)val,LOOSE), !bVar7)) {
                if (this->threads == true) {
                  auVar19 = llvm::Value::getName();
                  if ((auVar19._8_8_ == 0xe) &&
                     (*(long *)((long)auVar19._0_8_ + 6) == 0x6574616572635f64 &&
                      *auVar19._0_8_ == 0x5f64616572687470)) {
                    getCalledFunctions(&local_60,
                                       *(Value **)
                                        (local_40 + -(ulong)(uint)(*(int *)(val + 0x14) << 5)),
                                       this->PTA);
                    ppFVar4 = local_60.
                              super__Vector_base<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>
                              ._M_impl.super__Vector_impl_data._M_finish;
                    pLVar9 = local_70;
                    for (ppFVar3 = local_60.
                                   super__Vector_base<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>
                                   ._M_impl.super__Vector_impl_data._M_start; local_70 = pLVar9,
                        ppFVar3 != ppFVar4; ppFVar3 = ppFVar3 + 1) {
                      pFVar15 = *ppFVar3;
                      if (*(Function **)(pFVar15 + 0x48) != pFVar15 + 0x48) {
                        pLVar12 = buildSubgraph(this,pLVar9,pFVar15,true);
                        Node<dg::LLVMDependenceGraph,_llvm::Value_*,_dg::LLVMNode>::addSubgraph
                                  (&pLVar9->
                                    super_Node<dg::LLVMDependenceGraph,_llvm::Value_*,_dg::LLVMNode>
                                   ,pLVar12);
                      }
                      pLVar9 = local_70;
                    }
                    if (local_60.
                        super__Vector_base<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>
                        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                      operator_delete(local_60.
                                      super__Vector_base<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>
                                      ._M_impl.super__Vector_impl_data._M_start,
                                      (long)local_60.
                                            super__Vector_base<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>
                                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                      (long)local_60.
                                            super__Vector_base<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>
                                            ._M_impl.super__Vector_impl_data._M_start);
                    }
                  }
                }
              }
              else {
                pLVar12 = buildSubgraph(this,local_70,pFVar15,false);
                Node<dg::LLVMDependenceGraph,_llvm::Value_*,_dg::LLVMNode>::addSubgraph
                          (&local_70->
                            super_Node<dg::LLVMDependenceGraph,_llvm::Value_*,_dg::LLVMNode>,pLVar12
                          );
              }
            }
            (**(code **)(*(long *)local_68.impl + 0x40))();
            cVar6 = (**(code **)(*(long *)local_68.impl + 0x38))();
            if (cVar6 != '\0') {
              local_68.impl = (LLVMPointsToSetImpl *)0x0;
            }
            bVar7 = LLVMPointsToSet::const_iterator::operator==(&local_68,&local_38);
          } while (!bVar7);
        }
        if (local_48 != (LLVMPointsToSetImpl *)0x0) {
          (**(code **)(*(long *)local_48 + 0x58))();
        }
      }
      goto LAB_00111466;
    }
  }
  else {
    if (this->gather_callsites != (char *)0x0) {
      auVar19 = llvm::Value::getName();
      __n = auVar19._8_8_;
      pcVar14 = this->gather_callsites;
      if (pcVar14 == (char *)0x0) {
        if (__n == 0) goto LAB_0011142c;
      }
      else {
        sVar11 = strlen(pcVar14);
        if ((__n == sVar11) && ((__n == 0 || (iVar8 = bcmp(auVar19._0_8_,pcVar14,__n), iVar8 == 0)))
           ) {
LAB_0011142c:
          std::
          _Rb_tree<dg::LLVMNode*,dg::LLVMNode*,std::_Identity<dg::LLVMNode*>,std::less<dg::LLVMNode*>,std::allocator<dg::LLVMNode*>>
          ::_M_insert_unique<dg::LLVMNode*const&>
                    ((_Rb_tree<dg::LLVMNode*,dg::LLVMNode*,std::_Identity<dg::LLVMNode*>,std::less<dg::LLVMNode*>,std::allocator<dg::LLVMNode*>>
                      *)this->gatheredCallsites,&local_70);
        }
      }
    }
    if (*(Function **)(callFunc + 0x48) != callFunc + 0x48) {
      pLVar12 = buildSubgraph(this,local_70,callFunc,false);
      Node<dg::LLVMDependenceGraph,_llvm::Value_*,_dg::LLVMNode>::addSubgraph
                (&local_70->super_Node<dg::LLVMDependenceGraph,_llvm::Value_*,_dg::LLVMNode>,pLVar12
                );
    }
LAB_00111466:
    lVar18 = *(long *)(val + -0x20);
    if ((((lVar18 != 0) && (*(char *)(lVar18 + 0x10) == '\0')) &&
        (*(long *)(lVar18 + 0x18) == *(long *)(val + 0x48))) &&
       ((*(byte *)(lVar18 + 0x17) & 0x10) != 0)) {
      auVar19 = llvm::Value::getName();
      piVar13 = auVar19._0_8_;
      if (auVar19._8_8_ == 7) {
        if (*(int *)((long)piVar13 + 3) == 0x636f6c6c && *piVar13 == 0x6c616572) goto LAB_001117a2;
      }
      else if ((auVar19._8_8_ == 6) &&
              (((short)piVar13[1] == 0x636f && *piVar13 == 0x6c6c616d ||
               ((short)piVar13[1] == 0x636f && *piVar13 == 0x6c6c6163)))) {
LAB_001117a2:
        addFormalParameter(this,val);
      }
    }
    if ((callFunc != (Function *)0x0) && (this->threads != false)) {
      auVar19 = llvm::Value::getName();
      if ((auVar19._8_8_ == 0xe) &&
         (*(long *)((long)auVar19._0_8_ + 6) == 0x6574616572635f64 &&
          *auVar19._0_8_ == 0x5f64616572687470)) {
        getCalledFunctions(&local_60,
                           *(Value **)(val + (0x40 - (ulong)(uint)(*(int *)(val + 0x14) << 5))),
                           this->PTA);
        for (ppFVar3 = local_60.
                       super__Vector_base<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>
                       ._M_impl.super__Vector_impl_data._M_start;
            ppFVar3 !=
            local_60.
            super__Vector_base<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>.
            _M_impl.super__Vector_impl_data._M_finish; ppFVar3 = ppFVar3 + 1) {
          pLVar12 = buildSubgraph(this,local_70,*ppFVar3,true);
          Node<dg::LLVMDependenceGraph,_llvm::Value_*,_dg::LLVMNode>::addSubgraph
                    (&local_70->super_Node<dg::LLVMDependenceGraph,_llvm::Value_*,_dg::LLVMNode>,
                     pLVar12);
        }
        if (local_60.
            super__Vector_base<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>.
            _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_60.
                          super__Vector_base<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_60.
                                super__Vector_base<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_60.
                                super__Vector_base<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
      }
    }
  }
  local_60.super__Vector_base<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)local_70;
  this_02 = (_Rb_tree<dg::LLVMNode*,dg::LLVMNode*,std::_Identity<dg::LLVMNode*>,std::less<dg::LLVMNode*>,std::allocator<dg::LLVMNode*>>
             *)&this->callNodes;
LAB_0011187f:
  std::
  _Rb_tree<dg::LLVMNode*,dg::LLVMNode*,std::_Identity<dg::LLVMNode*>,std::less<dg::LLVMNode*>,std::allocator<dg::LLVMNode*>>
  ::_M_insert_unique<dg::LLVMNode*const&>(this_02,(LLVMNode **)&local_60);
  return;
}

Assistant:

void LLVMDependenceGraph::handleInstruction(llvm::Value *val, LLVMNode *node,
                                            LLVMNode *prevNode) {
    using namespace llvm;

    if (CallInst *CInst = dyn_cast<CallInst>(val)) {
#if LLVM_VERSION_MAJOR >= 8
        Value *strippedValue = CInst->getCalledOperand()->stripPointerCasts();
#else
        Value *strippedValue = CInst->getCalledValue()->stripPointerCasts();
#endif
        Function *func = dyn_cast<Function>(strippedValue);
        // if func is nullptr, then this is indirect call
        // via function pointer. If we have the points-to information,
        // create the subgraph
        if (!func && !CInst->isInlineAsm() && PTA) {
            using namespace dg::pta;
            auto pts = PTA->getLLVMPointsTo(strippedValue);
            if (pts.empty()) {
                llvmutils::printerr("Had no PTA node", strippedValue);
            }
            for (const LLVMPointer &ptr : pts) {
                // vararg may introduce imprecision here, so we
                // must check that it is really pointer to a function
                Function *F = dyn_cast<Function>(ptr.value);
                if (!F)
                    continue;

                if (F->empty() || !llvmutils::callIsCompatible(F, CInst)) {
                    if (threads && F && F->getName() == "pthread_create") {
                        auto possibleFunctions = getCalledFunctions(
                                CInst->getArgOperand(2), PTA);
                        for (auto &function : possibleFunctions) {
                            if (!function->empty()) {
                                LLVMDependenceGraph *subg = buildSubgraph(
                                        node,
                                        const_cast<llvm::Function *>(function),
                                        true /*this is fork*/);
                                node->addSubgraph(subg);
                            }
                        }
                    } else {
                        // incompatible prototypes or the function
                        // is only declaration
                        continue;
                    }
                } else {
                    LLVMDependenceGraph *subg = buildSubgraph(node, F);
                    node->addSubgraph(subg);
                }
            }
        }

        if (func && gather_callsites &&
            func->getName().equals(gather_callsites)) {
            gatheredCallsites->insert(node);
        }

        if (is_func_defined(func)) {
            LLVMDependenceGraph *subg = buildSubgraph(node, func);
            node->addSubgraph(subg);
        }

        // if we allocate a memory in a function, we can pass
        // it to other functions, so it is like global.
        // We need it as parameter, so that if we define it,
        // we can add def-use edges from parent, through the parameter
        // to the definition
        if (isMemAllocationFunc(CInst->getCalledFunction()))
            addFormalParameter(val);

        if (threads && func && func->getName() == "pthread_create") {
            auto possibleFunctions =
                    getCalledFunctions(CInst->getArgOperand(2), PTA);
            for (auto &function : possibleFunctions) {
                auto *subg = buildSubgraph(
                        node, const_cast<llvm::Function *>(function),
                        true /*this is fork*/);
                node->addSubgraph(subg);
            }
        }

        // no matter what is the function, this is a CallInst,
        // so create call-graph
        addCallNode(node);
    } else if (isa<UnreachableInst>(val)) {
        auto *noret = getOrCreateNoReturn();
        node->addControlDependence(noret);
        // unreachable is being inserted because of the previous instr
        // aborts the program. This means that whether it is executed
        // depends on the previous instr
        if (prevNode)
            prevNode->addControlDependence(noret);
    } else if (Instruction *Inst = dyn_cast<Instruction>(val)) {
        if (isa<LoadInst>(val) || isa<GetElementPtrInst>(val)) {
            Value *op = Inst->getOperand(0)->stripInBoundsOffsets();
            if (isa<GlobalVariable>(op))
                addFormalGlobal(op);
        } else if (isa<StoreInst>(val)) {
            Value *op = Inst->getOperand(0)->stripInBoundsOffsets();
            if (isa<GlobalVariable>(op))
                addFormalGlobal(op);

            op = Inst->getOperand(1)->stripInBoundsOffsets();
            if (isa<GlobalVariable>(op))
                addFormalGlobal(op);
        }
    }
}